

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O1

LBBox3fa * __thiscall
embree::SceneGraph::Transformations::lbounds
          (LBBox3fa *__return_storage_ptr__,Transformations *this,LBBox3fa *cbounds)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  size_t sVar5;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  long lVar42;
  ulong uVar43;
  ulong uVar44;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar45;
  undefined1 auVar46 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar47;
  undefined1 auVar48 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar49;
  undefined1 auVar50 [16];
  float fVar54;
  float fVar56;
  undefined1 auVar51 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar52;
  float fVar55;
  float fVar57;
  undefined1 auVar53 [16];
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  avector<BBox<Vec3fa>_> local_40;
  
  sVar5 = (this->spaces).size_active;
  if (sVar5 == 1) {
    pAVar6 = (this->spaces).items;
    fVar58 = (pAVar6->l).vx.field_0.m128[0];
    fVar59 = (pAVar6->l).vx.field_0.m128[1];
    fVar60 = (pAVar6->l).vx.field_0.m128[2];
    fVar56 = (pAVar6->l).vx.field_0.m128[3];
    fVar62 = (pAVar6->l).vy.field_0.m128[0];
    fVar54 = (pAVar6->l).vy.field_0.m128[1];
    fVar55 = (pAVar6->l).vy.field_0.m128[2];
    fVar57 = (pAVar6->l).vy.field_0.m128[3];
    fVar63 = (pAVar6->l).vz.field_0.m128[0];
    fVar64 = (pAVar6->l).vz.field_0.m128[1];
    fVar65 = (pAVar6->l).vz.field_0.m128[2];
    fVar61 = (pAVar6->l).vz.field_0.m128[3];
    fVar84 = (pAVar6->p).field_0.m128[0];
    fVar87 = (pAVar6->p).field_0.m128[1];
    fVar90 = (pAVar6->p).field_0.m128[2];
    fVar93 = (pAVar6->p).field_0.m128[3];
    fVar77 = (cbounds->bounds0).lower.field_0.m128[0];
    fVar83 = (cbounds->bounds0).lower.field_0.m128[1];
    fVar82 = (cbounds->bounds0).lower.field_0.m128[2];
    fVar66 = fVar82 * fVar63 + fVar84;
    fVar71 = fVar82 * fVar64 + fVar87;
    fVar72 = fVar82 * fVar65 + fVar90;
    fVar73 = fVar82 * fVar61 + fVar93;
    fVar78 = fVar83 * fVar62 + fVar66;
    fVar79 = fVar83 * fVar54 + fVar71;
    fVar80 = fVar83 * fVar55 + fVar72;
    fVar81 = fVar83 * fVar57 + fVar73;
    fVar74 = fVar77 * fVar58;
    fVar75 = fVar77 * fVar59;
    fVar76 = fVar77 * fVar60;
    fVar77 = fVar77 * fVar56;
    fVar82 = fVar74 + fVar78;
    fVar85 = fVar75 + fVar79;
    fVar88 = fVar76 + fVar80;
    fVar91 = fVar77 + fVar81;
    auVar30._4_4_ = fVar85;
    auVar30._0_4_ = fVar82;
    auVar30._8_4_ = fVar88;
    auVar30._12_4_ = fVar91;
    auVar48 = minps(_DAT_0024ec60,auVar30);
    auVar31._4_4_ = fVar85;
    auVar31._0_4_ = fVar82;
    auVar31._8_4_ = fVar88;
    auVar31._12_4_ = fVar91;
    auVar51 = maxps(_DAT_0024ec70,auVar31);
    fVar82 = (cbounds->bounds0).upper.field_0.m128[2];
    fVar94 = fVar82 * fVar63 + fVar84;
    fVar95 = fVar82 * fVar64 + fVar87;
    fVar96 = fVar82 * fVar65 + fVar90;
    fVar97 = fVar82 * fVar61 + fVar93;
    fVar82 = fVar83 * fVar62 + fVar94;
    fVar85 = fVar83 * fVar54 + fVar95;
    fVar88 = fVar83 * fVar55 + fVar96;
    fVar91 = fVar83 * fVar57 + fVar97;
    fVar83 = fVar74 + fVar82;
    fVar86 = fVar75 + fVar85;
    fVar89 = fVar76 + fVar88;
    fVar92 = fVar77 + fVar91;
    auVar32._4_4_ = fVar86;
    auVar32._0_4_ = fVar83;
    auVar32._8_4_ = fVar89;
    auVar32._12_4_ = fVar92;
    auVar48 = minps(auVar48,auVar32);
    auVar33._4_4_ = fVar86;
    auVar33._0_4_ = fVar83;
    auVar33._8_4_ = fVar89;
    auVar33._12_4_ = fVar92;
    auVar51 = maxps(auVar51,auVar33);
    fVar83 = (cbounds->bounds0).upper.field_0.m128[1];
    fVar66 = fVar66 + fVar83 * fVar62;
    fVar71 = fVar71 + fVar83 * fVar54;
    fVar72 = fVar72 + fVar83 * fVar55;
    fVar73 = fVar73 + fVar83 * fVar57;
    fVar86 = fVar74 + fVar66;
    fVar89 = fVar75 + fVar71;
    fVar92 = fVar76 + fVar72;
    fVar98 = fVar77 + fVar73;
    auVar38._4_4_ = fVar89;
    auVar38._0_4_ = fVar86;
    auVar38._8_4_ = fVar92;
    auVar38._12_4_ = fVar98;
    auVar48 = minps(auVar48,auVar38);
    auVar39._4_4_ = fVar89;
    auVar39._0_4_ = fVar86;
    auVar39._8_4_ = fVar92;
    auVar39._12_4_ = fVar98;
    auVar51 = maxps(auVar51,auVar39);
    fVar94 = fVar83 * fVar62 + fVar94;
    fVar95 = fVar83 * fVar54 + fVar95;
    fVar96 = fVar83 * fVar55 + fVar96;
    fVar97 = fVar83 * fVar57 + fVar97;
    fVar74 = fVar74 + fVar94;
    fVar75 = fVar75 + fVar95;
    fVar76 = fVar76 + fVar96;
    fVar77 = fVar77 + fVar97;
    auVar16._4_4_ = fVar75;
    auVar16._0_4_ = fVar74;
    auVar16._8_4_ = fVar76;
    auVar16._12_4_ = fVar77;
    auVar48 = minps(auVar48,auVar16);
    auVar17._4_4_ = fVar75;
    auVar17._0_4_ = fVar74;
    auVar17._8_4_ = fVar76;
    auVar17._12_4_ = fVar77;
    auVar51 = maxps(auVar51,auVar17);
    fVar77 = (cbounds->bounds0).upper.field_0.m128[0];
    fVar83 = fVar77 * fVar58;
    fVar74 = fVar77 * fVar59;
    fVar75 = fVar77 * fVar60;
    fVar77 = fVar77 * fVar56;
    fVar78 = fVar78 + fVar83;
    fVar79 = fVar79 + fVar74;
    fVar80 = fVar80 + fVar75;
    fVar81 = fVar81 + fVar77;
    auVar24._4_4_ = fVar79;
    auVar24._0_4_ = fVar78;
    auVar24._8_4_ = fVar80;
    auVar24._12_4_ = fVar81;
    auVar48 = minps(auVar48,auVar24);
    auVar25._4_4_ = fVar79;
    auVar25._0_4_ = fVar78;
    auVar25._8_4_ = fVar80;
    auVar25._12_4_ = fVar81;
    auVar51 = maxps(auVar51,auVar25);
    fVar82 = fVar82 + fVar83;
    fVar85 = fVar85 + fVar74;
    fVar88 = fVar88 + fVar75;
    fVar91 = fVar91 + fVar77;
    auVar11._4_4_ = fVar85;
    auVar11._0_4_ = fVar82;
    auVar11._8_4_ = fVar88;
    auVar11._12_4_ = fVar91;
    auVar48 = minps(auVar48,auVar11);
    auVar12._4_4_ = fVar85;
    auVar12._0_4_ = fVar82;
    auVar12._8_4_ = fVar88;
    auVar12._12_4_ = fVar91;
    auVar51 = maxps(auVar51,auVar12);
    auVar67._0_4_ = fVar66 + fVar83;
    auVar67._4_4_ = fVar71 + fVar74;
    auVar67._8_4_ = fVar72 + fVar75;
    auVar67._12_4_ = fVar73 + fVar77;
    auVar48 = minps(auVar48,auVar67);
    auVar51 = maxps(auVar51,auVar67);
    fVar83 = fVar83 + fVar94;
    fVar74 = fVar74 + fVar95;
    fVar75 = fVar75 + fVar96;
    fVar77 = fVar77 + fVar97;
    auVar18._4_4_ = fVar74;
    auVar18._0_4_ = fVar83;
    auVar18._8_4_ = fVar75;
    auVar18._12_4_ = fVar77;
    aVar49 = (anon_union_16_2_47237d3f_for_Vec3fa_0)minps(auVar48,auVar18);
    auVar19._4_4_ = fVar74;
    auVar19._0_4_ = fVar83;
    auVar19._8_4_ = fVar75;
    auVar19._12_4_ = fVar77;
    aVar52 = (anon_union_16_2_47237d3f_for_Vec3fa_0)maxps(auVar51,auVar19);
    fVar83 = (cbounds->bounds1).lower.field_0.m128[0];
    fVar82 = (cbounds->bounds1).lower.field_0.m128[1];
    fVar77 = (cbounds->bounds1).lower.field_0.m128[2];
    fVar66 = fVar77 * fVar63 + fVar84;
    fVar71 = fVar77 * fVar64 + fVar87;
    fVar72 = fVar77 * fVar65 + fVar90;
    fVar73 = fVar77 * fVar61 + fVar93;
    fVar78 = fVar82 * fVar62 + fVar66;
    fVar79 = fVar82 * fVar54 + fVar71;
    fVar80 = fVar82 * fVar55 + fVar72;
    fVar81 = fVar82 * fVar57 + fVar73;
    fVar74 = fVar83 * fVar58;
    fVar75 = fVar83 * fVar59;
    fVar76 = fVar83 * fVar60;
    fVar83 = fVar83 * fVar56;
    fVar77 = fVar74 + fVar78;
    fVar85 = fVar75 + fVar79;
    fVar88 = fVar76 + fVar80;
    fVar91 = fVar83 + fVar81;
    auVar34._4_4_ = fVar85;
    auVar34._0_4_ = fVar77;
    auVar34._8_4_ = fVar88;
    auVar34._12_4_ = fVar91;
    auVar48 = minps(_DAT_0024ec60,auVar34);
    auVar35._4_4_ = fVar85;
    auVar35._0_4_ = fVar77;
    auVar35._8_4_ = fVar88;
    auVar35._12_4_ = fVar91;
    auVar46 = maxps(_DAT_0024ec70,auVar35);
    fVar77 = (cbounds->bounds1).upper.field_0.m128[2];
    fVar84 = fVar77 * fVar63 + fVar84;
    fVar87 = fVar77 * fVar64 + fVar87;
    fVar90 = fVar77 * fVar65 + fVar90;
    fVar93 = fVar77 * fVar61 + fVar93;
    fVar85 = fVar82 * fVar62 + fVar84;
    fVar88 = fVar82 * fVar54 + fVar87;
    fVar91 = fVar82 * fVar55 + fVar90;
    fVar82 = fVar82 * fVar57 + fVar93;
    fVar77 = fVar74 + fVar85;
    fVar63 = fVar75 + fVar88;
    fVar64 = fVar76 + fVar91;
    fVar65 = fVar83 + fVar82;
    auVar9._4_4_ = fVar63;
    auVar9._0_4_ = fVar77;
    auVar9._8_4_ = fVar64;
    auVar9._12_4_ = fVar65;
    auVar51 = minps(auVar48,auVar9);
    auVar10._4_4_ = fVar63;
    auVar10._0_4_ = fVar77;
    auVar10._8_4_ = fVar64;
    auVar10._12_4_ = fVar65;
    auVar46 = maxps(auVar46,auVar10);
    fVar77 = (cbounds->bounds1).upper.field_0.m128[1];
    fVar66 = fVar66 + fVar77 * fVar62;
    fVar71 = fVar71 + fVar77 * fVar54;
    fVar72 = fVar72 + fVar77 * fVar55;
    fVar73 = fVar73 + fVar77 * fVar57;
    fVar63 = fVar74 + fVar66;
    fVar64 = fVar75 + fVar71;
    fVar65 = fVar76 + fVar72;
    fVar61 = fVar83 + fVar73;
    auVar48._4_4_ = fVar64;
    auVar48._0_4_ = fVar63;
    auVar48._8_4_ = fVar65;
    auVar48._12_4_ = fVar61;
    auVar48 = minps(auVar51,auVar48);
    auVar51._4_4_ = fVar64;
    auVar51._0_4_ = fVar63;
    auVar51._8_4_ = fVar65;
    auVar51._12_4_ = fVar61;
    auVar51 = maxps(auVar46,auVar51);
    fVar84 = fVar77 * fVar62 + fVar84;
    fVar87 = fVar77 * fVar54 + fVar87;
    fVar90 = fVar77 * fVar55 + fVar90;
    fVar93 = fVar77 * fVar57 + fVar93;
    fVar74 = fVar74 + fVar84;
    fVar75 = fVar75 + fVar87;
    fVar76 = fVar76 + fVar90;
    fVar83 = fVar83 + fVar93;
    auVar20._4_4_ = fVar75;
    auVar20._0_4_ = fVar74;
    auVar20._8_4_ = fVar76;
    auVar20._12_4_ = fVar83;
    auVar48 = minps(auVar48,auVar20);
    auVar21._4_4_ = fVar75;
    auVar21._0_4_ = fVar74;
    auVar21._8_4_ = fVar76;
    auVar21._12_4_ = fVar83;
    auVar51 = maxps(auVar51,auVar21);
    fVar77 = (cbounds->bounds1).upper.field_0.m128[0];
    fVar58 = fVar77 * fVar58;
    fVar59 = fVar77 * fVar59;
    fVar60 = fVar77 * fVar60;
    fVar77 = fVar77 * fVar56;
    fVar78 = fVar78 + fVar58;
    fVar79 = fVar79 + fVar59;
    fVar80 = fVar80 + fVar60;
    fVar81 = fVar81 + fVar77;
    auVar26._4_4_ = fVar79;
    auVar26._0_4_ = fVar78;
    auVar26._8_4_ = fVar80;
    auVar26._12_4_ = fVar81;
    auVar48 = minps(auVar48,auVar26);
    auVar27._4_4_ = fVar79;
    auVar27._0_4_ = fVar78;
    auVar27._8_4_ = fVar80;
    auVar27._12_4_ = fVar81;
    auVar51 = maxps(auVar51,auVar27);
    fVar85 = fVar85 + fVar58;
    fVar88 = fVar88 + fVar59;
    fVar91 = fVar91 + fVar60;
    fVar82 = fVar82 + fVar77;
    auVar13._4_4_ = fVar88;
    auVar13._0_4_ = fVar85;
    auVar13._8_4_ = fVar91;
    auVar13._12_4_ = fVar82;
    auVar48 = minps(auVar48,auVar13);
    auVar14._4_4_ = fVar88;
    auVar14._0_4_ = fVar85;
    auVar14._8_4_ = fVar91;
    auVar14._12_4_ = fVar82;
    auVar51 = maxps(auVar51,auVar14);
    auVar68._0_4_ = fVar66 + fVar58;
    auVar68._4_4_ = fVar71 + fVar59;
    auVar68._8_4_ = fVar72 + fVar60;
    auVar68._12_4_ = fVar73 + fVar77;
    auVar48 = minps(auVar48,auVar68);
    auVar51 = maxps(auVar51,auVar68);
    fVar58 = fVar58 + fVar84;
    fVar59 = fVar59 + fVar87;
    fVar60 = fVar60 + fVar90;
    fVar77 = fVar77 + fVar93;
    auVar7._4_4_ = fVar59;
    auVar7._0_4_ = fVar58;
    auVar7._8_4_ = fVar60;
    auVar7._12_4_ = fVar77;
    aVar45 = (anon_union_16_2_47237d3f_for_Vec3fa_0)minps(auVar48,auVar7);
    auVar8._4_4_ = fVar59;
    auVar8._0_4_ = fVar58;
    auVar8._8_4_ = fVar60;
    auVar8._12_4_ = fVar77;
    aVar47 = (anon_union_16_2_47237d3f_for_Vec3fa_0)maxps(auVar51,auVar8);
    (__return_storage_ptr__->bounds0).lower.field_0 = aVar49;
    (__return_storage_ptr__->bounds0).upper.field_0 = aVar52;
    (__return_storage_ptr__->bounds1).lower.field_0 = aVar45;
    (__return_storage_ptr__->bounds1).upper.field_0 = aVar47;
  }
  else {
    local_40.size_active = 0;
    local_40.size_alloced = 0;
    local_40.items = (BBox<embree::Vec3fa> *)0x0;
    if (sVar5 != 0) {
      local_40.items = (BBox<embree::Vec3fa> *)alignedMalloc(sVar5 << 5,0x10);
      local_40.size_alloced = sVar5;
    }
    auVar51 = _DAT_0024ec70;
    auVar48 = _DAT_0024ec60;
    uVar44 = (this->spaces).size_active;
    if (uVar44 != 0) {
      lVar42 = 0x10;
      uVar43 = 0;
      do {
        pAVar6 = (this->spaces).items;
        pfVar2 = (float *)((long)pAVar6 + lVar42 * 2 + -0x20);
        pfVar3 = (float *)((long)pAVar6 + lVar42 * 2 + -0x10);
        pfVar1 = (float *)((long)&(pAVar6->l).vx.field_0 + lVar42 * 2);
        pfVar4 = (float *)((long)&(pAVar6->l).vy.field_0 + lVar42 * 2);
        fVar62 = (float)uVar43 / (float)(uVar44 - 1);
        fVar77 = 1.0 - fVar62;
        fVar60 = (cbounds->bounds0).lower.field_0.m128[0] * fVar77 +
                 (cbounds->bounds1).lower.field_0.m128[0] * fVar62;
        fVar54 = (cbounds->bounds0).lower.field_0.m128[1] * fVar77 +
                 (cbounds->bounds1).lower.field_0.m128[1] * fVar62;
        fVar56 = (cbounds->bounds0).lower.field_0.m128[2] * fVar77 +
                 (cbounds->bounds1).lower.field_0.m128[2] * fVar62;
        fVar58 = fVar77 * (cbounds->bounds0).upper.field_0.m128[0] +
                 fVar62 * (cbounds->bounds1).upper.field_0.m128[0];
        fVar59 = fVar77 * (cbounds->bounds0).upper.field_0.m128[1] +
                 fVar62 * (cbounds->bounds1).upper.field_0.m128[1];
        fVar77 = fVar77 * (cbounds->bounds0).upper.field_0.m128[2] +
                 fVar62 * (cbounds->bounds1).upper.field_0.m128[2];
        fVar62 = fVar56 * *pfVar1 + *pfVar4;
        fVar55 = fVar56 * pfVar1[1] + pfVar4[1];
        fVar57 = fVar56 * pfVar1[2] + pfVar4[2];
        fVar63 = fVar56 * pfVar1[3] + pfVar4[3];
        fVar64 = fVar54 * *pfVar3;
        fVar65 = fVar54 * pfVar3[1];
        fVar61 = fVar54 * pfVar3[2];
        fVar54 = fVar54 * pfVar3[3];
        fVar82 = fVar64 + fVar62;
        fVar66 = fVar65 + fVar55;
        fVar71 = fVar61 + fVar57;
        fVar72 = fVar54 + fVar63;
        fVar90 = fVar60 * *pfVar2;
        fVar93 = fVar60 * pfVar2[1];
        fVar83 = fVar60 * pfVar2[2];
        fVar60 = fVar60 * pfVar2[3];
        fVar56 = fVar90 + fVar82;
        fVar84 = fVar93 + fVar66;
        fVar87 = fVar83 + fVar71;
        fVar73 = fVar60 + fVar72;
        auVar40._4_4_ = fVar84;
        auVar40._0_4_ = fVar56;
        auVar40._8_4_ = fVar87;
        auVar40._12_4_ = fVar73;
        auVar46 = minps(auVar48,auVar40);
        auVar41._4_4_ = fVar84;
        auVar41._0_4_ = fVar56;
        auVar41._8_4_ = fVar87;
        auVar41._12_4_ = fVar73;
        auVar69 = maxps(auVar51,auVar41);
        fVar91 = fVar77 * *pfVar1 + *pfVar4;
        fVar74 = fVar77 * pfVar1[1] + pfVar4[1];
        fVar75 = fVar77 * pfVar1[2] + pfVar4[2];
        fVar76 = fVar77 * pfVar1[3] + pfVar4[3];
        fVar64 = fVar64 + fVar91;
        fVar65 = fVar65 + fVar74;
        fVar61 = fVar61 + fVar75;
        fVar54 = fVar54 + fVar76;
        fVar77 = fVar90 + fVar64;
        fVar56 = fVar93 + fVar65;
        fVar84 = fVar83 + fVar61;
        fVar87 = fVar60 + fVar54;
        auVar36._4_4_ = fVar56;
        auVar36._0_4_ = fVar77;
        auVar36._8_4_ = fVar84;
        auVar36._12_4_ = fVar87;
        auVar46 = minps(auVar46,auVar36);
        auVar37._4_4_ = fVar56;
        auVar37._0_4_ = fVar77;
        auVar37._8_4_ = fVar84;
        auVar37._12_4_ = fVar87;
        auVar69 = maxps(auVar69,auVar37);
        fVar73 = fVar59 * *pfVar3;
        fVar85 = fVar59 * pfVar3[1];
        fVar88 = fVar59 * pfVar3[2];
        fVar59 = fVar59 * pfVar3[3];
        fVar62 = fVar62 + fVar73;
        fVar55 = fVar55 + fVar85;
        fVar57 = fVar57 + fVar88;
        fVar63 = fVar63 + fVar59;
        fVar77 = fVar90 + fVar62;
        fVar56 = fVar93 + fVar55;
        fVar84 = fVar83 + fVar57;
        fVar87 = fVar60 + fVar63;
        auVar70._4_4_ = fVar56;
        auVar70._0_4_ = fVar77;
        auVar70._8_4_ = fVar84;
        auVar70._12_4_ = fVar87;
        auVar46 = minps(auVar46,auVar70);
        auVar15._4_4_ = fVar56;
        auVar15._0_4_ = fVar77;
        auVar15._8_4_ = fVar84;
        auVar15._12_4_ = fVar87;
        auVar69 = maxps(auVar69,auVar15);
        fVar73 = fVar73 + fVar91;
        fVar85 = fVar85 + fVar74;
        fVar88 = fVar88 + fVar75;
        fVar59 = fVar59 + fVar76;
        fVar90 = fVar90 + fVar73;
        fVar93 = fVar93 + fVar85;
        fVar83 = fVar83 + fVar88;
        fVar60 = fVar60 + fVar59;
        auVar22._4_4_ = fVar93;
        auVar22._0_4_ = fVar90;
        auVar22._8_4_ = fVar83;
        auVar22._12_4_ = fVar60;
        auVar46 = minps(auVar46,auVar22);
        auVar23._4_4_ = fVar93;
        auVar23._0_4_ = fVar90;
        auVar23._8_4_ = fVar83;
        auVar23._12_4_ = fVar60;
        auVar70 = maxps(auVar69,auVar23);
        fVar77 = fVar58 * *pfVar2;
        fVar60 = fVar58 * pfVar2[1];
        fVar56 = fVar58 * pfVar2[2];
        fVar58 = fVar58 * pfVar2[3];
        fVar82 = fVar82 + fVar77;
        fVar66 = fVar66 + fVar60;
        fVar71 = fVar71 + fVar56;
        fVar72 = fVar72 + fVar58;
        auVar28._4_4_ = fVar66;
        auVar28._0_4_ = fVar82;
        auVar28._8_4_ = fVar71;
        auVar28._12_4_ = fVar72;
        auVar69 = minps(auVar46,auVar28);
        auVar29._4_4_ = fVar66;
        auVar29._0_4_ = fVar82;
        auVar29._8_4_ = fVar71;
        auVar29._12_4_ = fVar72;
        auVar70 = maxps(auVar70,auVar29);
        fVar64 = fVar64 + fVar77;
        fVar65 = fVar65 + fVar60;
        fVar61 = fVar61 + fVar56;
        fVar54 = fVar54 + fVar58;
        auVar46._4_4_ = fVar65;
        auVar46._0_4_ = fVar64;
        auVar46._8_4_ = fVar61;
        auVar46._12_4_ = fVar54;
        auVar46 = minps(auVar69,auVar46);
        auVar69._4_4_ = fVar65;
        auVar69._0_4_ = fVar64;
        auVar69._8_4_ = fVar61;
        auVar69._12_4_ = fVar54;
        auVar69 = maxps(auVar70,auVar69);
        auVar53._0_4_ = fVar62 + fVar77;
        auVar53._4_4_ = fVar55 + fVar60;
        auVar53._8_4_ = fVar57 + fVar56;
        auVar53._12_4_ = fVar63 + fVar58;
        auVar46 = minps(auVar46,auVar53);
        auVar69 = maxps(auVar69,auVar53);
        auVar50._0_4_ = fVar77 + fVar73;
        auVar50._4_4_ = fVar60 + fVar85;
        auVar50._8_4_ = fVar56 + fVar88;
        auVar50._12_4_ = fVar58 + fVar59;
        auVar46 = minps(auVar46,auVar50);
        auVar69 = maxps(auVar69,auVar50);
        *(undefined1 (*) [16])((long)local_40.items + lVar42 + -0x10) = auVar46;
        *(undefined1 (*) [16])((long)&((local_40.items)->lower).field_0 + lVar42) = auVar69;
        uVar43 = uVar43 + 1;
        uVar44 = (this->spaces).size_active;
        lVar42 = lVar42 + 0x20;
      } while (uVar43 < uVar44);
    }
    local_40.size_active = local_40.size_alloced;
    LBBox<embree::Vec3fa>::LBBox(__return_storage_ptr__,&local_40);
    alignedFree(local_40.items);
  }
  return __return_storage_ptr__;
}

Assistant:

LBBox3fa lbounds ( const LBBox3fa& cbounds ) const 
      {
        assert(spaces.size());
        if (spaces.size() == 1) 
        {
          return LBBox3fa(xfmBounds(spaces[0],cbounds.bounds0),
                          xfmBounds(spaces[0],cbounds.bounds1));
        }
        else
        {
          avector<BBox3fa> bounds(spaces.size());
          for (size_t i=0; i<spaces.size(); i++) {
            const float f = float(i)/float(spaces.size()-1);
            bounds[i] = xfmBounds(spaces[i],cbounds.interpolate(f));
          }
          return LBBox3fa(bounds);
        }
      }